

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::GetToolset
          (cmGlobalGhsMultiGenerator *this,cmMakefile *mf,string *tsd,string *ts)

{
  string *directory;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string msg_1;
  undefined1 local_108 [8];
  string tryPath;
  undefined1 local_c8 [8];
  string msg;
  string local_a0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *ghsRoot;
  string *ts_local;
  string *tsd_local;
  cmMakefile *mf_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  ghsRoot = (char *)ts;
  ts_local = tsd;
  tsd_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GHS_TOOLSET_ROOT",&local_51);
  pcVar2 = cmMakefile::GetDefinition(mf,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((pcVar2 == (char *)0x0) || (local_30 = pcVar2, *pcVar2 == '\0')) {
    local_30 = DEFAULT_TOOLSET_ROOT;
  }
  std::__cxx11::string::operator=((string *)ts_local,local_30);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_108);
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&msg_1.field_2 + 8),(string *)ghsRoot,ts_local);
    std::__cxx11::string::operator=((string *)local_108,(string *)(msg_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::FileExists((string *)local_108);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)ts_local,(string *)local_108);
    }
    else {
      std::operator+(&local_168,"GHS toolset \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &local_168,"\" not found.");
      std::__cxx11::string::~string((string *)&local_168);
      cmSystemTools::Error((string *)local_148);
      std::__cxx11::string::operator=((string *)ts_local,"");
      std::__cxx11::string::~string((string *)local_148);
    }
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80);
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)ts_local,"/");
    }
    directory = ts_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"comp_[^;]+",(allocator<char> *)(msg.field_2._M_local_buf + 0xf))
    ;
    cmSystemTools::Glob(directory,&local_a0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tryPath.field_2 + 8),"No GHS toolsets found in GHS_TOOLSET_ROOT \"",
                     ts_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tryPath.field_2 + 8),"\".");
      std::__cxx11::string::~string((string *)(tryPath.field_2._M_local_buf + 8));
      cmSystemTools::Error((string *)local_c8);
      std::__cxx11::string::operator=((string *)ts_local,"");
      std::__cxx11::string::~string((string *)local_c8);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
      std::__cxx11::string::operator+=((string *)ts_local,(string *)pvVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetToolset(cmMakefile* mf, std::string& tsd,
                                           const std::string& ts)
{
  const char* ghsRoot = mf->GetDefinition("GHS_TOOLSET_ROOT");

  if (!ghsRoot || ghsRoot[0] == '\0') {
    ghsRoot = DEFAULT_TOOLSET_ROOT;
  }
  tsd = ghsRoot;

  if (ts.empty()) {
    std::vector<std::string> output;

    // Use latest? version
    if (tsd.back() != '/') {
      tsd += "/";
    }
    cmSystemTools::Glob(tsd, "comp_[^;]+", output);

    if (output.empty()) {
      std::string msg =
        "No GHS toolsets found in GHS_TOOLSET_ROOT \"" + tsd + "\".";
      cmSystemTools::Error(msg);
      tsd = "";
    } else {
      tsd += output.back();
    }
  } else {
    std::string tryPath;
    tryPath = cmSystemTools::CollapseFullPath(ts, tsd);
    if (!cmSystemTools::FileExists(tryPath)) {
      std::string msg = "GHS toolset \"" + tryPath + "\" not found.";
      cmSystemTools::Error(msg);
      tsd = "";
    } else {
      tsd = tryPath;
    }
  }
}